

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

void opl_set_mute_mask(void *chip,UINT32 MuteMask)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)chip + 0xdd;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    *(bool *)lVar1 = (MuteMask >> ((uint)lVar2 & 0x1f) & 1) != 0;
    lVar1 = lVar1 + 0xc0;
  }
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    *(bool *)((long)chip + lVar1 + 0x6e0) = (MuteMask >> ((int)lVar1 + 9U & 0x1f) & 1) != 0;
  }
  return;
}

Assistant:

void opl_set_mute_mask(void *chip, UINT32 MuteMask)
{
	FM_OPL *opl = (FM_OPL *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 9; CurChn ++)
		opl->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		opl->MuteSpc[CurChn] = (MuteMask >> (9 + CurChn)) & 0x01;
	
	return;
}